

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_Varint64::_Run(_Test_Varint64 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *limit_00;
  _Alloc_hider p_00;
  ulong uVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  char *p;
  uint64_t actual;
  char *limit;
  string s;
  uint64_t power;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  int local_20c;
  uint64_t local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  string local_1f8;
  long local_1d8;
  Tester local_1d0;
  
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_1d0.ok_ = false;
  local_1d0._1_7_ = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
            (&local_238,(iterator)0x0,(unsigned_long *)&local_1d0);
  local_1d0.ok_ = true;
  local_1d0._1_7_ = 0;
  if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&local_238,
               (iterator)
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(unsigned_long *)&local_1d0);
  }
  else {
    *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_finish = 100;
    local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1d0.ok_ = true;
  local_1d0._1_7_ = 0xffffffffffffff;
  if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&local_238,
               (iterator)
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(unsigned_long *)&local_1d0);
  }
  else {
    *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_finish = 0xffffffffffffffff;
    local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1d0.ok_ = true;
  local_1d0._1_7_ = 0xffffffffffffff;
  if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&local_238,
               (iterator)
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,(unsigned_long *)&local_1d0);
  }
  else {
    *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_finish = 0xfffffffffffffffe;
    local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  lVar2 = 0;
  do {
    local_1d0._0_8_ = 1L << ((byte)lVar2 & 0x3f);
    if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_238,
                 (iterator)
                 local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish,(unsigned_long *)&local_1d0);
    }
    else {
      *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = local_1d0._0_8_;
      local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_1f8._M_dataplus._M_p = (pointer)(local_1d0._0_8_ - 1);
    if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&local_238,
                 (iterator)
                 local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish,(unsigned_long *)&local_1f8);
    }
    else {
      *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = (unsigned_long)local_1f8._M_dataplus._M_p;
      local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_1f8._M_dataplus._M_p = (pointer)(local_1d0._0_8_ + 1);
    if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&local_238,
                 (iterator)
                 local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish,(unsigned_long *)&local_1f8);
    }
    else {
      *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = (unsigned_long)local_1f8._M_dataplus._M_p;
      local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x40);
  local_218 = &local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  local_200 = local_218;
  local_1f8._M_dataplus._M_p = (pointer)local_218;
  if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      PutVarint64(&local_1f8,
                  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)local_238.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_238.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    limit_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_1f8._M_dataplus._M_p + local_1f8._M_string_length);
    local_218 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p;
    local_200 = limit_00;
    if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar2 = 0;
      uVar3 = 0;
      p_00._M_p = local_1f8._M_dataplus._M_p;
      do {
        local_1d0.ok_ = true;
        local_1d0.fname_ =
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
        ;
        local_1d0.line_ = 0x7b;
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
        test::Tester::Is(&local_1d0,p_00._M_p < limit_00,"p < limit");
        test::Tester::~Tester(&local_1d0);
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)GetVarint64Ptr(p_00._M_p,limit_00->_M_local_buf,&local_208);
        local_1d0.ok_ = true;
        local_1d0.fname_ =
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
        ;
        local_1d0.line_ = 0x7f;
        local_218 = paVar1;
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
        test::Tester::Is(&local_1d0,
                         paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)0x0,"p != nullptr");
        test::Tester::~Tester(&local_1d0);
        local_1d0.ok_ = true;
        local_1d0.fname_ =
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
        ;
        local_1d0.line_ = 0x80;
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
        test::Tester::IsEq<unsigned_long,unsigned_long>
                  (&local_1d0,
                   (unsigned_long *)
                   ((long)local_238.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar2),&local_208);
        test::Tester::~Tester(&local_1d0);
        local_1d0.ok_ = true;
        local_1d0.fname_ =
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
        ;
        local_1d0.line_ = 0x81;
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
        local_20c = VarintLength(local_208);
        local_1d8 = (long)paVar1 - (long)p_00._M_p;
        test::Tester::IsEq<int,long>(&local_1d0,&local_20c,&local_1d8);
        test::Tester::~Tester(&local_1d0);
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 8;
        p_00._M_p = (pointer)paVar1;
      } while (uVar3 < (ulong)((long)local_238.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_238.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  local_1d0.line_ = 0x83;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  test::Tester::IsEq<char_const*,char_const*>(&local_1d0,(char **)&local_218,(char **)&local_200);
  test::Tester::~Tester(&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Coding, Varint64) {
  // Construct the list of values to check
  std::vector<uint64_t> values;
  // Some special values
  values.push_back(0);
  values.push_back(100);
  values.push_back(~static_cast<uint64_t>(0));
  values.push_back(~static_cast<uint64_t>(0) - 1);
  for (uint32_t k = 0; k < 64; k++) {
    // Test values near powers of two
    const uint64_t power = 1ull << k;
    values.push_back(power);
    values.push_back(power - 1);
    values.push_back(power + 1);
  }

  std::string s;
  for (size_t i = 0; i < values.size(); i++) {
    PutVarint64(&s, values[i]);
  }

  const char* p = s.data();
  const char* limit = p + s.size();
  for (size_t i = 0; i < values.size(); i++) {
    ASSERT_TRUE(p < limit);
    uint64_t actual;
    const char* start = p;
    p = GetVarint64Ptr(p, limit, &actual);
    ASSERT_TRUE(p != nullptr);
    ASSERT_EQ(values[i], actual);
    ASSERT_EQ(VarintLength(actual), p - start);
  }
  ASSERT_EQ(p, limit);
}